

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O2

Result * validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetwork>
                   (Result *__return_storage_ptr__,ModelDescription *interface,NeuralNetwork *nn,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *outputBlobNames,bool isUpdatable)

{
  void **ppvVar1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  uint32 uVar4;
  void *pvVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  ArrayFeatureType *pAVar10;
  mapped_type *pmVar11;
  Rep *pRVar12;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this;
  Result *this_00;
  ArrayFeatureType_ShapeRange *pAVar13;
  ArrayFeatureType_EnumeratedShapes *pAVar14;
  iterator iVar15;
  _Base_ptr p_Var16;
  int iVar17;
  long lVar18;
  void **ppvVar19;
  long lVar20;
  undefined8 *puVar21;
  void **ppvVar22;
  FeatureType *pFVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  NeuralNetworkSpecValidator validator;
  Result r;
  NeuralNetworkShaper shaper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ioBlobNameToRank;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  inputBlobs;
  
  CoreML::Result::Result(&r);
  pRVar12 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar12 != (Rep *)0x0) {
    pRVar12 = (Rep *)pRVar12->elements;
  }
  lVar24 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_ * 8;
  lVar9 = 0;
  do {
    lVar20 = lVar9;
    if (lVar24 == lVar20) break;
    puVar21 = *(undefined8 **)(*(long *)((long)pRVar12->elements + lVar20 + -8) + 0x20);
    if (puVar21 == (undefined8 *)0x0) {
      puVar21 = &CoreML::Specification::_FeatureType_default_instance_;
    }
    lVar9 = lVar20 + 8;
  } while (*(int *)((long)puVar21 + 0x24) != 5);
  iVar17 = nn->arrayinputshapemapping_;
  iVar3 = nn->imageinputshapemapping_;
  pRVar12 = (nn->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar12 != (Rep *)0x0) {
    pRVar12 = (Rep *)pRVar12->elements;
  }
  lVar25 = (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_ * 8;
  lVar9 = 0;
  do {
    lVar18 = lVar9;
    if (lVar25 == lVar18) break;
    bVar7 = CoreML::isIOS12NeuralNetworkLayer
                      (*(NeuralNetworkLayer **)((long)pRVar12->elements + lVar18 + -8));
    lVar9 = lVar18 + 8;
  } while (bVar7);
  bVar26 = lVar25 != lVar18;
  bVar7 = iVar17 != 0;
  bVar6 = iVar3 != 0;
  if (((lVar24 == lVar20) || (iVar17 != 0)) || (lVar25 == lVar18)) {
    if (((lVar24 == lVar20) || (iVar17 != 0)) || (iVar3 == 0)) {
      lVar9 = (long)(interface->input_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar9 == 0) {
        std::__cxx11::string::string
                  ((string *)&validator,"Neural networks require at least one input.",
                   (allocator *)&shaper);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
      }
      else if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        std::__cxx11::string::string
                  ((string *)&validator,"Neural networks produce at least one output.",
                   (allocator *)&shaper);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
      }
      else if ((nn->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        std::__cxx11::string::string
                  ((string *)&validator,"Neural networks require at least one layer.",
                   (allocator *)&shaper);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&validator)
        ;
      }
      else {
        pRVar12 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
        ppvVar22 = pRVar12->elements;
        if (pRVar12 == (Rep *)0x0) {
          ppvVar22 = (void **)0x0;
        }
        bVar8 = std::
                all_of<google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription_const>,validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetwork>(CoreML::Specification::ModelDescription_const&,CoreML::Specification::NeuralNetwork_const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,bool)::_lambda(CoreML::Specification::FeatureDescription_const&)_1_>
                          (ppvVar22,ppvVar22 + lVar9);
        if (!bVar8) {
          std::__cxx11::string::string((string *)&validator,"inputs",(allocator *)&shaper);
          CoreML::validateInputOutputTypes
                    (__return_storage_ptr__,&interface->input_,MODEL_INPUT_TYPE_INVALID,
                     (string *)&validator);
          std::__cxx11::string::~string((string *)&validator);
          bVar8 = CoreML::Result::good(__return_storage_ptr__);
          if (bVar8) {
            std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header;
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
            ;
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pRVar12 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
            iVar17 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
            ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((bVar7 || bVar6) || bVar26) {
              ppvVar22 = pRVar12->elements;
              if (pRVar12 == (Rep *)0x0) {
                ppvVar22 = (void **)0x0;
              }
              for (lVar9 = 0; (long)iVar17 * 8 != lVar9; lVar9 = lVar9 + 8) {
                lVar24 = *(long *)((long)ppvVar22 + lVar9);
                pFVar23 = *(FeatureType **)(lVar24 + 0x20);
                if (pFVar23 == (FeatureType *)0x0) {
                  pFVar23 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                }
                if (pFVar23->_oneof_case_[0] == 4) {
                  if (nn->imageinputshapemapping_ == 0) {
                    pmVar11 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](&ioBlobNameToRank,*(key_type **)(lVar24 + 0x10));
LAB_0021aa39:
                    *pmVar11 = 5;
                  }
                  else {
                    pmVar11 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](&ioBlobNameToRank,*(key_type **)(lVar24 + 0x10));
                    *pmVar11 = 4;
                  }
                }
                else if (pFVar23->_oneof_case_[0] == 5) {
                  if (nn->arrayinputshapemapping_ == 0) {
                    pmVar11 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              ::operator[](&ioBlobNameToRank,*(key_type **)(lVar24 + 0x10));
                    goto LAB_0021aa39;
                  }
                  pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                  iVar3 = (pAVar10->shape_).current_size_;
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::operator[](&ioBlobNameToRank,*(key_type **)(lVar24 + 0x10));
                  *pmVar11 = iVar3;
                }
              }
              pRVar12 = (interface->output_).super_RepeatedPtrFieldBase.rep_;
              ppvVar22 = pRVar12->elements;
              if (pRVar12 == (Rep *)0x0) {
                ppvVar22 = (void **)0x0;
              }
              iVar17 = (interface->output_).super_RepeatedPtrFieldBase.current_size_;
              for (lVar9 = 0; (long)iVar17 * 8 != lVar9; lVar9 = lVar9 + 8) {
                lVar24 = *(long *)((long)ppvVar22 + lVar9);
                pFVar23 = *(FeatureType **)(lVar24 + 0x20);
                if (pFVar23 == (FeatureType *)0x0) {
                  pFVar23 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                }
                if ((pFVar23->_oneof_case_[0] == 5) &&
                   (pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23),
                   (pAVar10->shape_).current_size_ != 0)) {
                  pFVar23 = *(FeatureType **)(lVar24 + 0x20);
                  if (pFVar23 == (FeatureType *)0x0) {
                    pFVar23 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                  }
                  pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                  iVar3 = (pAVar10->shape_).current_size_;
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::operator[](&ioBlobNameToRank,*(key_type **)(lVar24 + 0x10));
                  *pmVar11 = iVar3;
                }
              }
              pRVar12 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
              iVar17 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
            }
            p_Var2 = &inputBlobs._M_t._M_impl.super__Rb_tree_header;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            ppvVar22 = pRVar12->elements;
            if (pRVar12 == (Rep *)0x0) {
              ppvVar22 = (void **)0x0;
            }
            ppvVar1 = ppvVar22 + iVar17;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
            inputBlobs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
            for (; ppvVar22 != ppvVar1; ppvVar22 = ppvVar22 + 1) {
              pvVar5 = *ppvVar22;
              std::__cxx11::string::string((string *)&validator,"__input",(allocator *)&shaper);
              this = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[](&inputBlobs,*(key_type **)((long)pvVar5 + 0x10));
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_assign_unique<std::__cxx11::string_const*>
                        (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &validator,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &validator.ModelIOBlobNameToRank._M_t._M_impl.super__Rb_tree_header.
                          _M_header._M_left);
              std::__cxx11::string::~string((string *)&validator);
              pFVar23 = *(FeatureType **)((long)pvVar5 + 0x20);
              if (pFVar23 == (FeatureType *)0x0) {
                pFVar23 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
              }
              if (pFVar23->_oneof_case_[0] == 5) {
                if ((bVar7 || bVar6) || bVar26) {
                  pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                  CoreML::validateNdMultiArrayInputType((Result *)&validator,pAVar10);
                  this_00 = CoreML::Result::operator=(&r,(Result *)&validator);
                  bVar8 = CoreML::Result::good(this_00);
                  std::__cxx11::string::~string((string *)&validator.ModelIOBlobNameToRank);
                  if (!bVar8) {
                    CoreML::Result::Result(__return_storage_ptr__,&r);
                    goto LAB_0021ae97;
                  }
                }
                else {
                  pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                  iVar17 = (pAVar10->shape_).current_size_;
                  if (0 < iVar17) {
                    pFVar23 = *(FeatureType **)((long)pvVar5 + 0x20);
                    if (pFVar23 == (FeatureType *)0x0) {
                      pFVar23 = (FeatureType *)
                                &CoreML::Specification::_FeatureType_default_instance_;
                    }
                    pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                    if ((pAVar10->shape_).current_size_ == 1) goto LAB_0021ac0a;
                    pFVar23 = *(FeatureType **)((long)pvVar5 + 0x20);
                    if (pFVar23 == (FeatureType *)0x0) {
                      pFVar23 = (FeatureType *)
                                &CoreML::Specification::_FeatureType_default_instance_;
                    }
                    pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                    if ((pAVar10->shape_).current_size_ == 3) goto LAB_0021ac0a;
                    std::__cxx11::string::string
                              ((string *)&validator,
                               "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                               ,(allocator *)&shaper);
                    CoreML::Result::Result
                              (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
LAB_0021af1c:
                    std::__cxx11::string::~string((string *)&validator);
                    goto LAB_0021ae97;
                  }
LAB_0021ac0a:
                  pFVar23 = *(FeatureType **)((long)pvVar5 + 0x20);
                  if (pFVar23 == (FeatureType *)0x0) {
                    pFVar23 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                  }
                  pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                  uVar4 = pAVar10->_oneof_case_[0];
                  if (uVar4 == 0) {
LAB_0021acdb:
                    if (iVar17 < 1) {
LAB_0021aec8:
                      std::__cxx11::string::string
                                ((string *)&validator,
                                 "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                                 ,(allocator *)&shaper);
                      CoreML::Result::Result
                                (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator
                                );
                      goto LAB_0021af1c;
                    }
                  }
                  else if (uVar4 == 0x15) {
                    pFVar23 = *(FeatureType **)((long)pvVar5 + 0x20);
                    if (pFVar23 == (FeatureType *)0x0) {
                      pFVar23 = (FeatureType *)
                                &CoreML::Specification::_FeatureType_default_instance_;
                    }
                    pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                    pAVar14 = CoreML::Specification::ArrayFeatureType::enumeratedshapes(pAVar10);
                    pRVar12 = (pAVar14->shapes_).super_RepeatedPtrFieldBase.rep_;
                    ppvVar19 = pRVar12->elements;
                    if (pRVar12 == (Rep *)0x0) {
                      ppvVar19 = (void **)0x0;
                    }
                    for (lVar9 = 0;
                        (long)(pAVar14->shapes_).super_RepeatedPtrFieldBase.current_size_ * 8 !=
                        lVar9; lVar9 = lVar9 + 8) {
                      if ((*(uint *)(*(long *)((long)ppvVar19 + lVar9) + 0x10) | 2) != 3)
                      goto LAB_0021acdb;
                    }
                  }
                  else if (uVar4 == 0x1f) {
                    pFVar23 = *(FeatureType **)((long)pvVar5 + 0x20);
                    if (pFVar23 == (FeatureType *)0x0) {
                      pFVar23 = (FeatureType *)
                                &CoreML::Specification::_FeatureType_default_instance_;
                    }
                    pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                    pAVar13 = CoreML::Specification::ArrayFeatureType::shaperange(pAVar10);
                    if ((pAVar13->sizeranges_).super_RepeatedPtrFieldBase.current_size_ != 1) {
                      pFVar23 = *(FeatureType **)((long)pvVar5 + 0x20);
                      if (pFVar23 == (FeatureType *)0x0) {
                        pFVar23 = (FeatureType *)
                                  &CoreML::Specification::_FeatureType_default_instance_;
                      }
                      pAVar10 = CoreML::Specification::FeatureType::multiarraytype(pFVar23);
                      pAVar13 = CoreML::Specification::ArrayFeatureType::shaperange(pAVar10);
                      if ((iVar17 < 1) &&
                         ((pAVar13->sizeranges_).super_RepeatedPtrFieldBase.current_size_ != 3))
                      goto LAB_0021aec8;
                    }
                  }
                }
              }
            }
            CoreML::NeuralNetworkSpecValidator::NeuralNetworkSpecValidator
                      (&validator,&inputBlobs,&ioBlobNameToRank,(bVar7 || bVar6) || bVar26,0,
                       &ioBlobNameToRank);
            CoreML::NeuralNetworkSpecValidator::
            validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                      ((Result *)&shaper,&validator,nn);
            CoreML::Result::operator=(&r,(Result *)&shaper);
            std::__cxx11::string::~string((string *)&shaper.blobColors);
            bVar8 = CoreML::Result::good(&r);
            if (bVar8) {
              for (p_Var16 = validator.blobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var16 != &validator.blobs._M_t._M_impl.super__Rb_tree_header;
                  p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
                iVar15 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::find(&inputBlobs._M_t,(key_type *)(p_Var16 + 1));
                if (((_Rb_tree_header *)iVar15._M_node == p_Var2) ||
                   ((_Base_ptr)0x1 < p_Var16[3]._M_parent)) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)outputBlobNames,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var16 + 1));
                }
              }
              if ((!bVar7 && !bVar6) && !bVar26) {
                CoreML::NeuralNetworkShaper::NeuralNetworkShaper
                          (&shaper,interface,&nn->layers_,true);
                CoreML::NeuralNetworkShaper::~NeuralNetworkShaper(&shaper);
              }
              bVar7 = CoreML::Result::good(&r);
              if (bVar7 && isUpdatable) {
                validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetwork>
                          ((Result *)&shaper,nn);
                CoreML::Result::operator=(&r,(Result *)&shaper);
                std::__cxx11::string::~string((string *)&shaper.blobColors);
                bVar7 = CoreML::Result::good(&r);
                if (bVar7) {
                  validateTrainingInputs<CoreML::Specification::NeuralNetwork>
                            ((Result *)&shaper,interface,nn);
                  CoreML::Result::operator=(&r,(Result *)&shaper);
                  std::__cxx11::string::~string((string *)&shaper.blobColors);
                  CoreML::Result::good(&r);
                }
              }
            }
            CoreML::Result::Result(__return_storage_ptr__,&r);
            CoreML::NeuralNetworkSpecValidator::~NeuralNetworkSpecValidator(&validator);
LAB_0021ae97:
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&inputBlobs._M_t);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree(&ioBlobNameToRank._M_t);
          }
          goto LAB_0021a8e5;
        }
        std::__cxx11::string::string
                  ((string *)&validator,"Neural networks require at least one non-optional input.",
                   (allocator *)&shaper);
        CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)&validator,
                 "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the image input Shape mapping is not \'RANK5_IMAGE_MAPPING\'"
                 ,(allocator *)&shaper);
      CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&validator,
               "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the network contains a layer added in version 4 (iOS 13) or later. Use \'EXACT_ARRAY_MAPPING\' instead."
               ,(allocator *)&shaper);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)&validator);
  }
  std::__cxx11::string::~string((string *)&validator);
LAB_0021a8e5:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validateNeuralNetworkTopLevel(const Specification::ModelDescription& interface,
                                     const T& nn, std::set<std::string>& outputBlobNames,
                                     bool isUpdatable) {
    Result r;
    
    // First calculate the value of the flag "ndArrayInterpretation"
    // ndArrayInterpretation == False ==> iOS 11/12 (old) execution path can be used, i.e. all tensors are static rank 5.
    // ndArrayInterpretation == True ==>  Tensors can have any rank (including 5).
    
    bool ndArrayInterpretation = false;

    bool hasNonIOS12Layer = false;
    bool hasNewArrayShapeMapping = false;
    bool hasNewImageShapeMapping = false;
    bool hasMultiArrayInput = false;

    for (const auto& input: interface.input()) {
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            hasMultiArrayInput = true;
            break;
        }
    }
    
    if (nn.arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
        hasNewArrayShapeMapping = true;
    }
    
    if (nn.imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
        hasNewImageShapeMapping = true;
    }
    
    for (const auto &layer: nn.layers()) {
        if (!isIOS12NeuralNetworkLayer(layer)) {
            hasNonIOS12Layer = true;
            break;
        }
    }
    
    if (hasNonIOS12Layer || hasNewArrayShapeMapping || hasNewImageShapeMapping) {
        ndArrayInterpretation = true;
    }
    
    if (hasNonIOS12Layer && !hasNewArrayShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the network contains a layer added in version 4 (iOS 13) or later. Use 'EXACT_ARRAY_MAPPING' instead.");
    }
    
    if (!hasNewArrayShapeMapping && hasNewImageShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the image input Shape mapping is not 'RANK5_IMAGE_MAPPING'");
    }
    
    //==================== End of logic to determine the value of "ndArrayInterpretation" ======================
    
    if (interface.input_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks require at least one input.");
    }
    
    if (interface.output_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks produce at least one output.");
    }
    
    if (nn.layers().size() == 0) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "Neural networks require at least one layer.");
    }
    
    if (std::all_of(interface.input().begin(), interface.input().end(),
                    [](const Specification::FeatureDescription& input) {
                        return input.type().isoptional();
                    })) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Neural networks require at least one non-optional input.");
                    }

    // Check the input types
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputTypes(interface.input(), ResultReason::MODEL_INPUT_TYPE_INVALID, "inputs"));

    std::map<std::string, int> ioBlobNameToRank; // to collect ranks of input/output blobs from the shapes present in the description
    
    // populate "ioBlobNameToRank"
    if (ndArrayInterpretation) {
        for (const auto& input: interface.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (nn.arrayinputshapemapping() == Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = input.type().multiarraytype().shape_size();
                }
            } else if (input.type().Type_case() == Specification::FeatureType::kImageType) {
                if (nn.imageinputshapemapping() == Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = 4;
                }
            }
        }
        for (const auto& output: interface.output()) {
            if (output.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (output.type().multiarraytype().shape_size()) {
                    ioBlobNameToRank[output.name()] = output.type().multiarraytype().shape_size();
                }
            }
        }
    }
    
    // Collect Model input names and do some checking
    
    // inputBlobs: For each named data blob, the name of the node which produced it (there can be multiple in if-else branches)
    std::map<std::string, std::set<std::string>> inputBlobs;
    for (const auto& input: interface.input()) {
        // For input blobs, we'll give them a dummy producing layer name
        inputBlobs[input.name()] = {"__input"};
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            
            if (!ndArrayInterpretation) {
                
                // only vector-like (rank 1) or image-like (rank 3) inputs are allowed
                bool validShapeFound = false;
                if (input.type().multiarraytype().shape().size() > 0) {
                    if (!(input.type().multiarraytype().shape().size() == 1
                          || input.type().multiarraytype().shape().size() == 3)) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                    }
                    else {
                        validShapeFound = true;
                    }
                }
                bool flexibilityIsRank1or3 = true;
                switch (input.type().multiarraytype().ShapeFlexibility_case()) {
                    case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                        for (const auto &shape : input.type().multiarraytype().enumeratedshapes().shapes()) {
                            if(shape.shape_size() != 1 && shape.shape_size() != 3) {
                                flexibilityIsRank1or3 = false;
                                break;
                            }
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kShapeRange:
                        flexibilityIsRank1or3 = (input.type().multiarraytype().shaperange().sizeranges_size() == 1 ||
                                                 input.type().multiarraytype().shaperange().sizeranges_size() == 3);
                        break;
                    case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        flexibilityIsRank1or3 = false;
                        break;
                }
                if (!flexibilityIsRank1or3 && !validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                } else if (flexibilityIsRank1or3) {
                    validShapeFound = true;
                }
                if (!validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                }
                
            } else { // validate input shape when "ndArrayInterpretation" is True

                if (!(r = validateNdMultiArrayInputType(input.type().multiarraytype())).good()) {
                    return r;
                }
            } // if else block on spec version to check validity of input shape
        }
    }
    
    // validate the Neural Network message
    
    //  create an object to validate neural network message
    NeuralNetworkSpecValidator validator(inputBlobs, ioBlobNameToRank, ndArrayInterpretation, 0, ioBlobNameToRank);
    
    r = validator.validateNeuralNetwork(nn);
    
    if (!r.good()) {
        return r;
    }
    
    // gather all output blobs of the graph
    for (auto& blob: validator.blobs){
        if (inputBlobs.find(blob.first) == inputBlobs.end()) {
            outputBlobNames.insert(blob.first);
        } else {
            // if we are here, this means this blob is also present in the set of "inputBlobs"
            // but it can still be a genuine output blob if multiple layers are generating it (e.g. copy layer)
            if (blob.second.size() > 1) {
                outputBlobNames.insert(blob.first);
            }
        }
    }
    
    // Call the shaper: compatibility with iOS 12
    if (!ndArrayInterpretation) {
        // Compute the shapes
        try {
            NeuralNetworkShaper shaper(interface, nn.layers());
        }
        catch(std::runtime_error& e) {
            std::string err = std::string("Error determining network blob shapes: ") + std::string(e.what());
            return Result(ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES, err);
        }
    }
    
    if (!r.good()) {
        return r;
    }
    
    if (isUpdatable) {
        r = validateUpdatableNeuralNetwork(nn);
        if (!r.good()) { return r; }

        r = validateTrainingInputs(interface, nn);
        if (!r.good()) { return r; }
    }
    
    return r;
    
}